

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O0

bool __thiscall
cmGlobVerificationManager::CacheEntryKey::operator<(CacheEntryKey *this,CacheEntryKey *r)

{
  bool bVar1;
  CacheEntryKey *r_local;
  CacheEntryKey *this_local;
  
  if ((this->Recurse & 1U) < (r->Recurse & 1U)) {
    this_local._7_1_ = true;
  }
  else if ((r->Recurse & 1U) < (this->Recurse & 1U)) {
    this_local._7_1_ = false;
  }
  else if ((this->ListDirectories & 1U) < (r->ListDirectories & 1U)) {
    this_local._7_1_ = true;
  }
  else if ((r->ListDirectories & 1U) < (this->ListDirectories & 1U)) {
    this_local._7_1_ = false;
  }
  else if ((this->FollowSymlinks & 1U) < (r->FollowSymlinks & 1U)) {
    this_local._7_1_ = true;
  }
  else if ((r->FollowSymlinks & 1U) < (this->FollowSymlinks & 1U)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = std::operator<(&this->Relative,&r->Relative);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = std::operator>(&this->Relative,&r->Relative);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = std::operator<(&this->Expression,&r->Expression);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          bVar1 = std::operator>(&this->Expression,&r->Expression);
          if (bVar1) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobVerificationManager::CacheEntryKey::operator<(
  const CacheEntryKey& r) const
{
  if (this->Recurse < r.Recurse) {
    return true;
  }
  if (this->Recurse > r.Recurse) {
    return false;
  }
  if (this->ListDirectories < r.ListDirectories) {
    return true;
  }
  if (this->ListDirectories > r.ListDirectories) {
    return false;
  }
  if (this->FollowSymlinks < r.FollowSymlinks) {
    return true;
  }
  if (this->FollowSymlinks > r.FollowSymlinks) {
    return false;
  }
  if (this->Relative < r.Relative) {
    return true;
  }
  if (this->Relative > r.Relative) {
    return false;
  }
  if (this->Expression < r.Expression) {
    return true;
  }
  if (this->Expression > r.Expression) {
    return false;
  }
  return false;
}